

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_cache.cc
# Opt level: O0

void leveldb::DeleteEntry(Slice *key,void *value)

{
  Table *this;
  TableAndFile *tf;
  void *value_local;
  Slice *key_local;
  
  this = *(Table **)((long)value + 8);
  if (this != (Table *)0x0) {
    Table::~Table(this);
    operator_delete(this);
  }
  if (*value != (long *)0x0) {
    (**(code **)(**value + 8))();
  }
  if (value != (void *)0x0) {
    operator_delete(value);
  }
  return;
}

Assistant:

static void DeleteEntry(const Slice& key, void* value) {
  TableAndFile* tf = reinterpret_cast<TableAndFile*>(value);
  delete tf->table;
  delete tf->file;
  delete tf;
}